

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O1

void divsufsortxx::helper::
     heapsort<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
               (iterator Td,iterator SA,value_type size)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  pos_type pVar4;
  BitmapArray<long> *pBVar5;
  long lVar6;
  BitmapArray<long> *pBVar7;
  ulong size_00;
  ulong size_01;
  long lVar8;
  
  pBVar7 = Td.array_;
  pVar4 = SA.pos_;
  pBVar5 = SA.array_;
  size_00 = size;
  if ((size & 1U) == 0) {
    size_00 = size - 1;
    lVar6 = ((size - ((long)size_00 >> 0x3f)) + -1 >> 1) + pVar4;
    iVar2 = (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5);
    lVar8 = size + -1 + pVar4;
    iVar3 = (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,lVar8);
    iVar2 = (*(pBVar7->super_Bitmap)._vptr_Bitmap[5])(pBVar7,CONCAT44(extraout_var,iVar2) + Td.pos_)
    ;
    iVar3 = (*(pBVar7->super_Bitmap)._vptr_Bitmap[5])
                      (pBVar7,Td.pos_ + CONCAT44(extraout_var_00,iVar3));
    if (CONCAT44(extraout_var_01,iVar2) < CONCAT44(extraout_var_02,iVar3)) {
      iVar2 = (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,lVar8);
      iVar3 = (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,lVar6);
      (*(pBVar5->super_Bitmap)._vptr_Bitmap[4])(pBVar5,lVar8,CONCAT44(extraout_var_04,iVar3));
      (*(pBVar5->super_Bitmap)._vptr_Bitmap[4])(pBVar5,lVar6,CONCAT44(extraout_var_03,iVar2));
    }
  }
  if (1 < (long)size_00) {
    lVar8 = (size_00 >> 1) + 1;
    do {
      fixdown<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long>
                (Td,SA,lVar8 + -2,size_00);
      lVar8 = lVar8 + -1;
    } while (1 < lVar8);
  }
  if ((size & 1U) == 0) {
    iVar2 = (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,pVar4);
    iVar3 = (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,pVar4 + size_00);
    (*(pBVar5->super_Bitmap)._vptr_Bitmap[4])(pBVar5,pVar4,CONCAT44(extraout_var_06,iVar3));
    (*(pBVar5->super_Bitmap)._vptr_Bitmap[4])
              (pBVar5,pVar4 + size_00,CONCAT44(extraout_var_05,iVar2));
    fixdown<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long>
              (Td,SA,0,size_00);
  }
  if (1 < (long)size_00) {
    do {
      size_01 = size_00 - 1;
      iVar2 = (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,pVar4);
      iVar3 = (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,pVar4 + size_01);
      (*(pBVar5->super_Bitmap)._vptr_Bitmap[4])(pBVar5,pVar4,CONCAT44(extraout_var_08,iVar3));
      fixdown<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long>
                (Td,SA,0,size_01);
      (*(pBVar5->super_Bitmap)._vptr_Bitmap[4])
                (pBVar5,pVar4 + size_01,CONCAT44(extraout_var_07,iVar2));
      bVar1 = 2 < (long)size_00;
      size_00 = size_01;
    } while (bVar1);
  }
  return;
}

Assistant:

void heapsort(const StringIterator_type Td, SAIterator_type SA,
              typename std::iterator_traits<SAIterator_type>::value_type size) {
  typedef typename std::iterator_traits<SAIterator_type>::value_type pos_type;
  pos_type i, m;
  pos_type t;

  m = size;
  if ((size % 2) == 0) {
    m--;
    if (Td[SA[m / 2]] < Td[SA[m]]) {
      std::iter_swap(SA + m, SA + m / 2);
    }
  }

  for (i = m / 2 - 1; 0 <= i; --i) {
    fixdown(Td, SA, i, m);
  }

  if ((size % 2) == 0) {
    std::iter_swap(SA, SA + m);
    fixdown(Td, SA, pos_type(0), m);
  }

  for (i = m - 1; 0 < i; --i) {
    t = SA[0];
    SA[0] = SA[i];
    fixdown(Td, SA, pos_type(0), i);
    SA[i] = t;
  }
}